

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O1

int __thiscall jrtplib::RTPTCPTransmitter::SetMaximumPacketSize(RTPTCPTransmitter *this,size_t s)

{
  int iVar1;
  
  iVar1 = -0xb5;
  if (((this->m_init == true) && (iVar1 = -0xbb, this->m_created == true)) &&
     (iVar1 = -0xc0, s < 0x10000)) {
    this->m_maxPackSize = s;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int RTPTCPTransmitter::SetMaximumPacketSize(size_t s)	
{
	if (!m_init)
		return ERR_RTP_TCPTRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	if (!m_created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_NOTCREATED;
	}
	if (s > RTPTCPTRANS_MAXPACKSIZE)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_SPECIFIEDSIZETOOBIG;
	}
	m_maxPackSize = s;
	MAINMUTEX_UNLOCK
	return 0;
}